

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Command * __thiscall cmState::GetCommand(Command *__return_storage_ptr__,cmState *this,string *name)

{
  string local_40;
  string *local_20;
  string *name_local;
  cmState *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (cmState *)__return_storage_ptr__;
  cmsys::SystemTools::LowerCase(&local_40,name);
  GetCommandByExactName(__return_storage_ptr__,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

cmState::Command cmState::GetCommand(std::string const& name) const
{
  return this->GetCommandByExactName(cmSystemTools::LowerCase(name));
}